

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_get_table_cb(void *pArg,int nCol,char **argv,char **colv)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  u64 n;
  ulong uVar7;
  
  iVar2 = *(int *)((long)pArg + 0x14);
  iVar6 = nCol << (argv != (char **)0x0 && iVar2 == 0);
  if (*(uint *)((long)pArg + 0x10) < (uint)(*(int *)((long)pArg + 0x1c) + iVar6)) {
    uVar1 = iVar6 + *(uint *)((long)pArg + 0x10) * 2;
    *(uint *)((long)pArg + 0x10) = uVar1;
    pvVar3 = sqlite3Realloc(*pArg,(ulong)uVar1 << 3);
    if (pvVar3 != (void *)0x0) {
      *(void **)pArg = pvVar3;
      iVar2 = *(int *)((long)pArg + 0x14);
      goto LAB_00129d78;
    }
LAB_00129e5f:
    *(undefined4 *)((long)pArg + 0x20) = 7;
LAB_00129e66:
    iVar2 = 1;
  }
  else {
LAB_00129d78:
    if (iVar2 == 0) {
      *(int *)((long)pArg + 0x18) = nCol;
      if (0 < nCol) {
        uVar7 = 0;
        do {
          pcVar4 = sqlite3_mprintf("%s",colv[uVar7]);
          if (pcVar4 == (char *)0x0) goto LAB_00129e5f;
          uVar1 = *(uint *)((long)pArg + 0x1c);
          *(uint *)((long)pArg + 0x1c) = uVar1 + 1;
          *(char **)(*pArg + (ulong)uVar1 * 8) = pcVar4;
          uVar7 = uVar7 + 1;
        } while ((uint)nCol != uVar7);
      }
    }
    else if (*(int *)((long)pArg + 0x18) != nCol) {
      sqlite3_free(*(void **)((long)pArg + 8));
      pcVar4 = sqlite3_mprintf("sqlite3_get_table() called with two or more incompatible queries");
      *(char **)((long)pArg + 8) = pcVar4;
      *(undefined4 *)((long)pArg + 0x20) = 1;
      goto LAB_00129e66;
    }
    iVar2 = 0;
    if (argv != (char **)0x0) {
      if (0 < nCol) {
        uVar7 = 0;
        do {
          if (argv[uVar7] == (char *)0x0) {
            pvVar3 = (void *)0x0;
          }
          else {
            sVar5 = strlen(argv[uVar7]);
            iVar2 = sqlite3_initialize();
            if (iVar2 != 0) goto LAB_00129e5f;
            n = (ulong)((uint)sVar5 & 0x3fffffff) + 1;
            pvVar3 = sqlite3Malloc(n);
            if (pvVar3 == (void *)0x0) goto LAB_00129e5f;
            memcpy(pvVar3,argv[uVar7],n);
          }
          uVar1 = *(uint *)((long)pArg + 0x1c);
          *(uint *)((long)pArg + 0x1c) = uVar1 + 1;
          *(void **)(*pArg + (ulong)uVar1 * 8) = pvVar3;
          uVar7 = uVar7 + 1;
        } while ((uint)nCol != uVar7);
      }
      *(int *)((long)pArg + 0x14) = *(int *)((long)pArg + 0x14) + 1;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int sqlite3_get_table_cb(void *pArg, int nCol, char **argv, char **colv){
  TabResult *p = (TabResult*)pArg;  /* Result accumulator */
  int need;                         /* Slots needed in p->azResult[] */
  int i;                            /* Loop counter */
  char *z;                          /* A single column of result */

  /* Make sure there is enough space in p->azResult to hold everything
  ** we need to remember from this invocation of the callback.
  */
  if( p->nRow==0 && argv!=0 ){
    need = nCol*2;
  }else{
    need = nCol;
  }
  if( p->nData + need > p->nAlloc ){
    char **azNew;
    p->nAlloc = p->nAlloc*2 + need;
    azNew = sqlite3Realloc( p->azResult, sizeof(char*)*p->nAlloc );
    if( azNew==0 ) goto malloc_failed;
    p->azResult = azNew;
  }

  /* If this is the first row, then generate an extra row containing
  ** the names of all columns.
  */
  if( p->nRow==0 ){
    p->nColumn = nCol;
    for(i=0; i<nCol; i++){
      z = sqlite3_mprintf("%s", colv[i]);
      if( z==0 ) goto malloc_failed;
      p->azResult[p->nData++] = z;
    }
  }else if( (int)p->nColumn!=nCol ){
    sqlite3_free(p->zErrMsg);
    p->zErrMsg = sqlite3_mprintf(
       "sqlite3_get_table() called with two or more incompatible queries"
    );
    p->rc = SQLITE_ERROR;
    return 1;
  }

  /* Copy over the row data
  */
  if( argv!=0 ){
    for(i=0; i<nCol; i++){
      if( argv[i]==0 ){
        z = 0;
      }else{
        int n = sqlite3Strlen30(argv[i])+1;
        z = sqlite3_malloc64( n );
        if( z==0 ) goto malloc_failed;
        memcpy(z, argv[i], n);
      }
      p->azResult[p->nData++] = z;
    }
    p->nRow++;
  }
  return 0;

malloc_failed:
  p->rc = SQLITE_NOMEM_BKPT;
  return 1;
}